

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall wasm::PrintSExpression::visitLoop(PrintSExpression *this,Loop *curr)

{
  ostream *this_00;
  char *in_RCX;
  Name name;
  
  this->controlFlowDepth = this->controlFlowDepth + 1;
  std::operator<<(this->o,'(');
  printExpressionContents(this,(Expression *)curr);
  incIndent(this);
  maybePrintImplicitBlock(this,curr->body);
  decIndent(this);
  if (this->full == true) {
    std::operator<<(this->o," ;; end loop");
    if ((curr->name).super_IString.str._M_str != (char *)0x0) {
      this_00 = std::operator<<(this->o,' ');
      name.super_IString.str._M_str = in_RCX;
      name.super_IString.str._M_len = (size_t)(curr->name).super_IString.str._M_str;
      wasm::operator<<((wasm *)this_00,(ostream *)(curr->name).super_IString.str._M_len,name);
    }
  }
  this->controlFlowDepth = this->controlFlowDepth + -1;
  return;
}

Assistant:

void PrintSExpression::visitLoop(Loop* curr) {
  controlFlowDepth++;
  o << '(';
  printExpressionContents(curr);
  incIndent();
  maybePrintImplicitBlock(curr->body);
  decIndent();
  if (full) {
    o << " ;; end loop";
    if (curr->name.is()) {
      o << ' ' << curr->name;
    }
  }
  controlFlowDepth--;
}